

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark-sizes.c
# Opt level: O1

int run_benchmark_sizes(void)

{
  fprintf(_stderr,"uv_shutdown_t: %u bytes\n",0x50);
  fprintf(_stderr,"uv_write_t: %u bytes\n",0xc0);
  fprintf(_stderr,"uv_connect_t: %u bytes\n",0x60);
  fprintf(_stderr,"uv_udp_send_t: %u bytes\n",0x140);
  fprintf(_stderr,"uv_tcp_t: %u bytes\n",0xf8);
  fprintf(_stderr,"uv_pipe_t: %u bytes\n",0x108);
  fprintf(_stderr,"uv_tty_t: %u bytes\n",0x138);
  fprintf(_stderr,"uv_prepare_t: %u bytes\n",0x78);
  fprintf(_stderr,"uv_check_t: %u bytes\n",0x78);
  fprintf(_stderr,"uv_idle_t: %u bytes\n",0x78);
  fprintf(_stderr,"uv_async_t: %u bytes\n",0x80);
  fprintf(_stderr,"uv_timer_t: %u bytes\n",0x98);
  fprintf(_stderr,"uv_fs_poll_t: %u bytes\n",0x68);
  fprintf(_stderr,"uv_fs_event_t: %u bytes\n",0x88);
  fprintf(_stderr,"uv_process_t: %u bytes\n",0x88);
  fprintf(_stderr,"uv_poll_t: %u bytes\n",0xa0);
  fprintf(_stderr,"uv_loop_t: %u bytes\n",0x350);
  fflush(_stderr);
  return 0;
}

Assistant:

BENCHMARK_IMPL(sizes) {
  fprintf(stderr, "uv_shutdown_t: %u bytes\n", (unsigned int) sizeof(uv_shutdown_t));
  fprintf(stderr, "uv_write_t: %u bytes\n", (unsigned int) sizeof(uv_write_t));
  fprintf(stderr, "uv_connect_t: %u bytes\n", (unsigned int) sizeof(uv_connect_t));
  fprintf(stderr, "uv_udp_send_t: %u bytes\n", (unsigned int) sizeof(uv_udp_send_t));
  fprintf(stderr, "uv_tcp_t: %u bytes\n", (unsigned int) sizeof(uv_tcp_t));
  fprintf(stderr, "uv_pipe_t: %u bytes\n", (unsigned int) sizeof(uv_pipe_t));
  fprintf(stderr, "uv_tty_t: %u bytes\n", (unsigned int) sizeof(uv_tty_t));
  fprintf(stderr, "uv_prepare_t: %u bytes\n", (unsigned int) sizeof(uv_prepare_t));
  fprintf(stderr, "uv_check_t: %u bytes\n", (unsigned int) sizeof(uv_check_t));
  fprintf(stderr, "uv_idle_t: %u bytes\n", (unsigned int) sizeof(uv_idle_t));
  fprintf(stderr, "uv_async_t: %u bytes\n", (unsigned int) sizeof(uv_async_t));
  fprintf(stderr, "uv_timer_t: %u bytes\n", (unsigned int) sizeof(uv_timer_t));
  fprintf(stderr, "uv_fs_poll_t: %u bytes\n", (unsigned int) sizeof(uv_fs_poll_t));
  fprintf(stderr, "uv_fs_event_t: %u bytes\n", (unsigned int) sizeof(uv_fs_event_t));
  fprintf(stderr, "uv_process_t: %u bytes\n", (unsigned int) sizeof(uv_process_t));
  fprintf(stderr, "uv_poll_t: %u bytes\n", (unsigned int) sizeof(uv_poll_t));
  fprintf(stderr, "uv_loop_t: %u bytes\n", (unsigned int) sizeof(uv_loop_t));
  fflush(stderr);
  return 0;
}